

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

void vkt::shaderexecutor::anon_unknown_0::generateFragShaderOutputDecl
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *outLocationMap,string *outputPrefix)

{
  pointer key;
  int location_;
  pointer pSVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  mapped_type_conflict *pmVar5;
  ostream *poVar6;
  ostream *poVar7;
  InternalError *this;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int local_150;
  int local_14c;
  ostream *local_148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  ShaderSpec *local_130;
  VarType uintType;
  string outVarName;
  VariableDeclaration decl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  VarType intType;
  
  local_140 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)CONCAT71(in_register_00000011,useIntOutputs);
  iVar2 = 0;
  local_148 = src;
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)outLocationMap;
  local_130 = shaderSpec;
  do {
    pSVar1 = (local_130->outputs).
             super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_130->outputs).
                     super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38) <= iVar2) {
      return;
    }
    key = pSVar1 + iVar2;
    local_14c = iVar2;
    pmVar5 = de::
             lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                       (local_140,&key->name);
    location_ = *pmVar5;
    std::operator+(&outVarName,local_138,&key->name);
    glu::Layout::Layout((Layout *)&intType,location_,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&decl,&pSVar1[iVar2].varType,&outVarName,STORAGE_OUT,INTERPOLATION_LAST,
               (Layout *)&intType,0);
    poVar6 = local_148;
    if (pSVar1[iVar2].varType.m_type != TYPE_BASIC) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this,(char *)0x0,"output.varType.isBasicType()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                 ,0xd5);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    DVar3 = (key->varType).m_data.basic.type;
    if (DVar3 - TYPE_BOOL < 4) {
      iVar2 = glu::getDataTypeScalarSize(DVar3);
      DVar3 = TYPE_INT;
      if (1 < iVar2) {
        DVar3 = glu::getDataTypeIntVec(iVar2);
      }
      glu::VarType::VarType(&intType,DVar3,PRECISION_HIGHP);
      glu::VarType::operator=(&decl.varType,&intType);
      poVar6 = glu::operator<<(poVar6,&decl);
      std::operator<<(poVar6,";\n");
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&intType;
LAB_007789bd:
      glu::VarType::~VarType((VarType *)this_00);
    }
    else {
      if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
        iVar2 = glu::getDataTypeMatrixNumRows(DVar3);
        iVar4 = glu::getDataTypeMatrixNumColumns((key->varType).m_data.basic.type);
        DVar3 = glu::getDataTypeUintVec(iVar2);
        glu::VarType::VarType(&uintType,DVar3,PRECISION_HIGHP);
        glu::VarType::operator=(&decl.varType,&uintType);
        for (local_150 = 0; local_150 < iVar4; local_150 = local_150 + 1) {
          std::operator+(&local_90,&outVarName,"_");
          de::toString<int>(&local_70,&local_150);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &intType,&local_90,&local_70);
          std::__cxx11::string::operator=((string *)&decl.name,(string *)&intType);
          std::__cxx11::string::~string((string *)&intType);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          decl.layout.location = local_150 + location_;
          poVar7 = glu::operator<<(poVar6,&decl);
          std::operator<<(poVar7,";\n");
        }
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uintType;
        goto LAB_007789bd;
      }
      poVar6 = glu::operator<<(local_148,&decl);
      std::operator<<(poVar6,";\n");
    }
    glu::VariableDeclaration::~VariableDeclaration(&decl);
    std::__cxx11::string::~string((string *)&outVarName);
    iVar2 = local_14c + 1;
  } while( true );
}

Assistant:

static void generateFragShaderOutputDecl (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& outputPrefix)
{
	for (int outNdx = 0; outNdx < (int)shaderSpec.outputs.size(); ++outNdx)
	{
		const Symbol&				output		= shaderSpec.outputs[outNdx];
		const int					location	= de::lookup(outLocationMap, output.name);
		const std::string			outVarName	= outputPrefix + output.name;
		glu::VariableDeclaration	decl		(output.varType, outVarName, glu::STORAGE_OUT, glu::INTERPOLATION_LAST, glu::Layout(location));

		TCU_CHECK_INTERNAL(output.varType.isBasicType());

		if (useIntOutputs && glu::isDataTypeFloatOrVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	intBasicType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType	intType			(intBasicType, glu::PRECISION_HIGHP);

			decl.varType = intType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeMatrix(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeMatrixNumRows(output.varType.getBasicType());
			const int			numVecs			= glu::getDataTypeMatrixNumColumns(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= glu::getDataTypeUintVec(vecSize);
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
			{
				decl.name				= outVarName + "_" + de::toString(vecNdx);
				decl.layout.location	= location + vecNdx;
				src << decl << ";\n";
			}
		}
		else
			src << decl << ";\n";
	}
}